

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O0

void __thiscall
geometrycentral::DependentQuantityD<double>::~DependentQuantityD(DependentQuantityD<double> *this)

{
  void *in_RDI;
  
  ~DependentQuantityD((DependentQuantityD<double> *)0x24f968);
  operator_delete(in_RDI);
  return;
}

Assistant:

DependentQuantityD(){}